

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O1

BN * gcdInverseEuclidean(BN *__return_storage_ptr__,BN *a,BN *mod)

{
  bool bVar1;
  BNsign *bn;
  BNsign x2;
  BNsign x0;
  BN A;
  BN Div;
  BN Mod;
  BN B;
  BN startMod;
  BNsign x1;
  BNsign local_170;
  BNsign local_150;
  BN *local_130;
  BNsign local_128;
  BN local_108;
  BN local_f0;
  BN local_d8;
  BN local_c0;
  BN local_a8;
  BNsign local_90;
  BNsign local_70;
  BNsign local_50;
  
  BN::BN(&local_a8,mod);
  BN::operator%(&local_108,a,mod);
  BN::BN(&local_c0,mod);
  bVar1 = BN::is0(&local_108);
  if (bVar1) {
    BN::bn0();
    BN::BN(__return_storage_ptr__,&local_128.value);
    goto LAB_0010b707;
  }
  BNsign::BNsign(&local_128);
  BN::bn0();
  BNsign::BNsign(&local_90,&local_170.value,false);
  if (local_170.value.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.value.ba.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  BN::bn1();
  BNsign::BNsign(&local_170,&local_150.value,false);
  if (local_150.value.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.value.ba.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  BN::BN(&local_f0);
  local_130 = __return_storage_ptr__;
  BN::BN(&local_d8);
  while( true ) {
    BN::divmod(&local_c0,&local_108,&local_f0,&local_d8);
    bVar1 = BN::is0(&local_d8);
    if (bVar1) break;
    BNsign::operator=(&local_128,&local_90);
    BNsign::operator=(&local_90,&local_170);
    BNsign::BNsign(&local_70,&local_f0,false);
    BNsign::operator*(&local_50,&local_90,&local_70);
    BNsign::operator-(&local_150,&local_128,&local_50);
    BNsign::operator=(&local_170,&local_150);
    if (local_150.value.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.value.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_50.value.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.value.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_70.value.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.value.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    BN::operator=(&local_c0,&local_108);
    BN::operator=(&local_108,&local_d8);
  }
  BN::bn1();
  bVar1 = BN::operator!=(&local_108,&local_150.value);
  if (local_150.value.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.value.ba.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  __return_storage_ptr__ = local_130;
  if (bVar1) {
    BN::bn0();
    BN::BN(__return_storage_ptr__,&local_150.value);
    if (local_150.value.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.value.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    if (local_170.sign == true) {
      bVar1 = BN::is0(&local_170.value);
      if (bVar1) goto LAB_0010b69b;
      bn = (BNsign *)BN::operator-=(&local_a8,&local_170.value);
    }
    else {
LAB_0010b69b:
      bn = &local_170;
    }
    BN::BN(__return_storage_ptr__,&bn->value);
  }
  if (local_d8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_170.value.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.value.ba.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.value.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.value.ba.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_0010b707:
  if (local_128.value.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.value.ba.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

BN gcdInverseEuclidean(const BN& a, const BN& mod)
{
    BN startMod(mod);

    BN A(a % mod);
    BN B(mod);

    if(A.is0())
        return move(BN::bn0());

    BNsign x0;
    BNsign x1(BN::bn0());
    BNsign x2(BN::bn1());
    BN Div;
    BN Mod;
    while (true) {
        B.divmod(A, Div, Mod);
        if (Mod.is0())
            break;
        x0 = move(x1);
        x1 = move(x2);

        x2 = x0 - x1 * (BNsign)Div;

        B = move(A);
        A = move(Mod);
    }

    if(A != BN::bn1())
        return move(BN::bn0());
    if(x2.sign && !x2.value.is0())
        return move(startMod -= x2.value);
    return move(x2.value);
}